

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * qStringAsUcs2Le(QString *src)

{
  unsigned_short uVar1;
  qsizetype qVar2;
  const_iterator pQVar3;
  char16_t *pcVar4;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  QString *__range1;
  unsigned_short *d;
  QByteArray *rc;
  QChar ch;
  QString *this;
  const_iterator local_40;
  unsigned_short *local_30;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  qVar2 = QString::size(in_RSI);
  QByteArray::QByteArray((QByteArray *)this,qVar2 << 1,'\0');
  local_30 = (unsigned_short *)QByteArray::data((QByteArray *)this);
  local_40 = QString::begin((QString *)0x20aefb);
  pQVar3 = QString::end(this);
  for (; local_40 != pQVar3; local_40 = local_40 + 1) {
    local_a.ucs = local_40->ucs;
    pcVar4 = QChar::unicode(&local_a);
    uVar1 = qToLittleEndian<unsigned_short>(*pcVar4);
    *local_30 = uVar1;
    local_30 = local_30 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

static QByteArray qStringAsUcs2Le(const QString& src)
{
    QByteArray rc(2*src.size(), 0);
    unsigned short *d = (unsigned short*)rc.data();
    for (QChar ch : src)
        *d++ = qToLittleEndian(quint16(ch.unicode()));

    return rc;
}